

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnRethrowExpr
          (BinaryReaderInterp *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Index catch_depth;
  char *pcStack_b0;
  anon_union_16_2_ecfd7102_for_Location_1 local_a8;
  Location loc_1;
  Var local_70;
  
  local_a8.field_0.last_column = 0;
  _catch_depth = (this->filename_)._M_len;
  pcStack_b0 = (this->filename_)._M_str;
  local_a8.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset = local_a8.field_1.offset;
  Var::Var(&local_70,depth,&loc_1);
  RVar1 = SharedValidator::OnRethrow(&this->validator_,(Location *)&catch_depth,&local_70);
  Var::~Var(&local_70);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = TypeChecker::GetCatchCount(&(this->validator_).typechecker_,depth,&catch_depth);
    if (RVar1.enum_ != Error) {
      Istream::Emit(this->istream_,Rethrow,catch_depth - 1);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnRethrowExpr(Index depth) {
  Index catch_depth;
  CHECK_RESULT(validator_.OnRethrow(GetLocation(), Var(depth, GetLocation())));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_depth));
  // The rethrow opcode takes an index into the exception stack rather than
  // the number of catch nestings, so we subtract one here.
  istream_.Emit(Opcode::Rethrow, catch_depth - 1);
  return Result::Ok;
}